

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O3

Type * __thiscall
slang::ast::GenericClassDefSymbol::getSpecializationImpl
          (GenericClassDefSymbol *this,ASTContext *context,SourceLocation instanceLoc,
          bool forceInvalidParams,ParameterValueAssignmentSyntax *syntax)

{
  size_t *psVar1;
  group_type_pointer pgVar2;
  SymbolIndex SVar3;
  Compilation *pCVar4;
  size_type sVar5;
  ParameterSymbol *this_00;
  _func_void_intptr_t_Compilation_ptr_ClassType_ptr_SourceLocation *p_Var6;
  group_type_pointer pgVar7;
  value_type_pointer ppVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL> parameterDecls;
  bool bVar12;
  byte bVar13;
  uint uVar14;
  int iVar15;
  Diagnostic *this_01;
  ParameterSymbolBase *pPVar16;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined7 in_register_00000009;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *src;
  __extent_storage<18446744073709551615UL> src_00;
  __extent_storage<18446744073709551615UL> extraout_RDX_02;
  ulong uVar17;
  long lVar18;
  ParameterValueAssignmentSyntax *pPVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  pointer decl;
  ClassSpecializationKey *other;
  ClassType *pCVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  byte bVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  byte bVar34;
  uchar uVar35;
  uchar uVar36;
  uchar uVar37;
  byte bVar38;
  uchar uVar39;
  uchar uVar40;
  uchar uVar41;
  byte bVar42;
  span<const_slang::ast::Type_*const,_18446744073709551615UL> typeParams_00;
  SourceRange referencingRange;
  span<const_slang::ConstantValue_*const,_18446744073709551615UL> paramValues_00;
  SourceLocation in_stack_fffffffffffffce8;
  try_emplace_args_t local_309;
  ClassType *classType;
  Compilation *local_300;
  ParameterValueAssignmentSyntax *local_2f8;
  ulong local_2f0;
  group_type_pointer local_2e8;
  ulong local_2e0;
  ulong local_2d8;
  ulong local_2d0;
  ulong local_2c8;
  Scope *local_2c0;
  uchar local_2b8;
  uchar uStack_2b7;
  uchar uStack_2b6;
  byte bStack_2b5;
  uchar uStack_2b4;
  uchar uStack_2b3;
  uchar uStack_2b2;
  byte bStack_2b1;
  uchar uStack_2b0;
  uchar uStack_2af;
  uchar uStack_2ae;
  byte bStack_2ad;
  uchar uStack_2ac;
  uchar uStack_2ab;
  uchar uStack_2aa;
  byte bStack_2a9;
  ClassSpecializationKey key;
  locator res;
  SmallVector<const_slang::ConstantValue_*,_5UL> paramValues;
  SmallVector<const_slang::ast::Type_*,_5UL> typeParams;
  ParameterBuilder paramBuilder;
  
  pCVar4 = ((context->scope).ptr)->compilation;
  local_2c0 = (this->super_Symbol).parentScope;
  uVar14 = this->recursionDepth + 1;
  this->recursionDepth = uVar14;
  if ((pCVar4->options).maxRecursiveClassSpecialization < uVar14) {
    this_01 = ASTContext::addDiag(context,(DiagCode)0x1f0009,instanceLoc);
    Diagnostic::operator<<(this_01,(this->super_Symbol).name);
    pCVar24 = (ClassType *)pCVar4->errorType;
    goto LAB_001db5b8;
  }
  classType = BumpAllocator::
              emplace<slang::ast::ClassType,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&>
                        (&pCVar4->super_BumpAllocator,pCVar4,&(this->super_Symbol).name,
                         &(this->super_Symbol).location);
  classType->genericClass = this;
  bVar12 = true;
  if (!forceInvalidParams) {
    bVar12 = Scope::isUninstantiated((context->scope).ptr);
  }
  classType->isUninstantiated = bVar12;
  SVar3 = (this->super_Symbol).indexInScope;
  (classType->super_Type).super_Symbol.parentScope = local_2c0;
  (classType->super_Type).super_Symbol.indexInScope = SVar3;
  parameterDecls._M_ptr =
       (this->paramDecls).super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.data_;
  parameterDecls._M_extent._M_extent_value =
       (this->paramDecls).super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.len;
  ParameterBuilder::ParameterBuilder
            (&paramBuilder,(context->scope).ptr,(this->super_Symbol).name,parameterDecls);
  local_2f0 = CONCAT44(local_2f0._4_4_,(int)CONCAT71(in_register_00000009,forceInvalidParams));
  paramBuilder.suppressErrors = syntax == (ParameterValueAssignmentSyntax *)0x0;
  local_300 = pCVar4;
  paramBuilder.instanceContext = context;
  paramBuilder.forceInvalidValues = forceInvalidParams;
  if (!paramBuilder.suppressErrors) {
    ParameterBuilder::setAssignments(&paramBuilder,syntax,false);
  }
  paramValues.super_SmallVectorBase<const_slang::ConstantValue_*>.data_ =
       (pointer)paramValues.super_SmallVectorBase<const_slang::ConstantValue_*>.firstElement;
  paramValues.super_SmallVectorBase<const_slang::ConstantValue_*>.len = 0;
  paramValues.super_SmallVectorBase<const_slang::ConstantValue_*>.cap = 5;
  src = (EVP_PKEY_CTX *)typeParams.super_SmallVectorBase<const_slang::ast::Type_*>.firstElement;
  typeParams.super_SmallVectorBase<const_slang::ast::Type_*>.len = 0;
  typeParams.super_SmallVectorBase<const_slang::ast::Type_*>.cap = 5;
  sVar5 = (this->paramDecls).super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.len;
  local_2f8 = syntax;
  typeParams.super_SmallVectorBase<const_slang::ast::Type_*>.data_ = (pointer)src;
  if (sVar5 != 0) {
    decl = (this->paramDecls).super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.
           data_;
    lVar18 = sVar5 << 6;
    do {
      pPVar16 = ParameterBuilder::createParam
                          (&paramBuilder,decl,&classType->super_Scope,instanceLoc);
      if (paramBuilder.anyErrors == true) {
        if (local_2f8 == (ParameterValueAssignmentSyntax *)0x0) {
          pCVar24 = (ClassType *)0x0;
        }
        else {
          pCVar24 = (ClassType *)local_300->errorType;
        }
        goto LAB_001db573;
      }
      src = extraout_RDX;
      if (pPVar16->isLocal == false) {
        this_00 = (ParameterSymbol *)pPVar16->symbol;
        if ((this_00->super_ValueSymbol).super_Symbol.kind == Parameter) {
          referencingRange.endLoc =
               (SourceLocation)
               ((long)instanceLoc * 0x10 + 0x100000000 >> 4 & 0xfffffffff0000000U |
               (ulong)(instanceLoc._0_4_ & 0xfffffff));
          referencingRange.startLoc = instanceLoc;
          key.paramValues._M_ptr = (pointer)ParameterSymbol::getValue(this_00,referencingRange);
          SmallVectorBase<slang::ConstantValue_const*>::emplace_back<slang::ConstantValue_const*>
                    ((SmallVectorBase<slang::ConstantValue_const*> *)&paramValues,
                     (ConstantValue **)&key);
          src = extraout_RDX_00;
        }
        else {
          key.paramValues._M_ptr =
               (pointer)DeclaredType::getType
                                  ((DeclaredType *)
                                   &(this_00->super_ValueSymbol).declaredType.dimensions);
          SmallVectorBase<slang::ast::Type_const*>::emplace_back<slang::ast::Type_const*>
                    ((SmallVectorBase<slang::ast::Type_const*> *)&typeParams,(Type **)&key);
          src = extraout_RDX_01;
        }
      }
      decl = decl + 1;
      lVar18 = lVar18 + -0x40;
    } while (lVar18 != 0);
  }
  pCVar4 = local_300;
  if ((char)local_2f0 == '\0') {
    iVar15 = SmallVectorBase<const_slang::ConstantValue_*>::copy
                       (&paramValues.super_SmallVectorBase<const_slang::ConstantValue_*>,
                        (EVP_PKEY_CTX *)local_300,src);
    paramValues_00._M_ptr._4_4_ = extraout_var;
    paramValues_00._M_ptr._0_4_ = iVar15;
    iVar15 = SmallVectorBase<const_slang::ast::Type_*>::copy
                       (&typeParams.super_SmallVectorBase<const_slang::ast::Type_*>,
                        (EVP_PKEY_CTX *)pCVar4,(EVP_PKEY_CTX *)src_00._M_extent_value);
    typeParams_00._M_ptr._4_4_ = extraout_var_00;
    typeParams_00._M_ptr._0_4_ = iVar15;
    typeParams_00._M_extent._M_extent_value = extraout_RDX_02._M_extent_value;
    paramValues_00._M_extent._M_extent_value = src_00._M_extent_value;
    detail::ClassSpecializationKey::ClassSpecializationKey(&key,paramValues_00,typeParams_00);
    if (classType->isUninstantiated == true) {
      auVar10._8_8_ = 0;
      auVar10._0_8_ = key.savedHash;
      pPVar19 = (ParameterValueAssignmentSyntax *)&this->uninstantiatedSpecMap;
      uVar23 = SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar10,8) ^
               SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar10,0);
      uVar21 = uVar23 >> ((byte)(this->uninstantiatedSpecMap).table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                                .arrays.groups_size_index & 0x3f);
      lVar18 = (uVar23 & 0xff) * 4;
      uVar27 = (&UNK_00474b6c)[lVar18];
      uVar28 = (&UNK_00474b6d)[lVar18];
      uVar29 = (&UNK_00474b6e)[lVar18];
      bVar30 = (&UNK_00474b6f)[lVar18];
      uVar17 = (ulong)((uint)uVar23 & 7);
      uVar20 = 0;
      uVar22 = uVar21;
      uVar31 = uVar27;
      uVar32 = uVar28;
      uVar33 = uVar29;
      bVar34 = bVar30;
      uVar35 = uVar27;
      uVar36 = uVar28;
      uVar37 = uVar29;
      bVar38 = bVar30;
      uVar39 = uVar27;
      uVar40 = uVar28;
      uVar41 = uVar29;
      bVar42 = bVar30;
      do {
        pgVar7 = (this->uninstantiatedSpecMap).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                 .arrays.groups_;
        pgVar2 = pgVar7 + uVar22;
        bVar13 = pgVar2->m[0xf].n;
        auVar25[0] = -(pgVar2->m[0].n == uVar27);
        auVar25[1] = -(pgVar2->m[1].n == uVar28);
        auVar25[2] = -(pgVar2->m[2].n == uVar29);
        auVar25[3] = -(pgVar2->m[3].n == bVar30);
        auVar25[4] = -(pgVar2->m[4].n == uVar31);
        auVar25[5] = -(pgVar2->m[5].n == uVar32);
        auVar25[6] = -(pgVar2->m[6].n == uVar33);
        auVar25[7] = -(pgVar2->m[7].n == bVar34);
        auVar25[8] = -(pgVar2->m[8].n == uVar35);
        auVar25[9] = -(pgVar2->m[9].n == uVar36);
        auVar25[10] = -(pgVar2->m[10].n == uVar37);
        auVar25[0xb] = -(pgVar2->m[0xb].n == bVar38);
        auVar25[0xc] = -(pgVar2->m[0xc].n == uVar39);
        auVar25[0xd] = -(pgVar2->m[0xd].n == uVar40);
        auVar25[0xe] = -(pgVar2->m[0xe].n == uVar41);
        auVar25[0xf] = -(bVar13 == bVar42);
        uVar14 = (uint)(ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe);
        if (uVar14 != 0) {
          local_2e8 = pgVar7 + uVar22;
          ppVar8 = (this->uninstantiatedSpecMap).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                   .arrays.elements_;
          local_2f8 = pPVar19;
          local_2e0 = uVar22;
          local_2d8 = uVar20;
          local_2d0 = uVar17;
          local_2c8 = uVar21;
          local_2b8 = uVar27;
          uStack_2b7 = uVar28;
          uStack_2b6 = uVar29;
          bStack_2b5 = bVar30;
          uStack_2b4 = uVar31;
          uStack_2b3 = uVar32;
          uStack_2b2 = uVar33;
          bStack_2b1 = bVar34;
          uStack_2b0 = uVar35;
          uStack_2af = uVar36;
          uStack_2ae = uVar37;
          bStack_2ad = bVar38;
          uStack_2ac = uVar39;
          uStack_2ab = uVar40;
          uStack_2aa = uVar41;
          bStack_2a9 = bVar42;
          do {
            local_2f0 = (ulong)uVar14;
            iVar15 = 0;
            if (uVar14 != 0) {
              for (; (uVar14 >> iVar15 & 1) == 0; iVar15 = iVar15 + 1) {
              }
            }
            other = (ClassSpecializationKey *)
                    ((long)&ppVar8[uVar22 * 0xf].first.paramValues._M_ptr +
                    (ulong)(uint)(iVar15 * 0x30));
            bVar12 = detail::ClassSpecializationKey::operator==(&key,other);
            if (bVar12) goto LAB_001db56a;
            uVar14 = (uint)local_2f0 - 1 & (uint)local_2f0;
          } while (uVar14 != 0);
          bVar13 = local_2e8->m[0xf].n;
          uVar17 = local_2d0;
          pPVar19 = local_2f8;
          uVar20 = local_2d8;
          uVar21 = local_2c8;
          uVar22 = local_2e0;
          uVar27 = local_2b8;
          uVar28 = uStack_2b7;
          uVar29 = uStack_2b6;
          bVar30 = bStack_2b5;
          uVar31 = uStack_2b4;
          uVar32 = uStack_2b3;
          uVar33 = uStack_2b2;
          bVar34 = bStack_2b1;
          uVar35 = uStack_2b0;
          uVar36 = uStack_2af;
          uVar37 = uStack_2ae;
          bVar38 = bStack_2ad;
          uVar39 = uStack_2ac;
          uVar40 = uStack_2ab;
          uVar41 = uStack_2aa;
          bVar42 = bStack_2a9;
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[uVar17] & bVar13) == 0) break;
        uVar9 = (this->uninstantiatedSpecMap).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                .arrays.groups_size_mask;
        lVar18 = uVar22 + uVar20;
        uVar20 = uVar20 + 1;
        uVar22 = lVar18 + 1U & uVar9;
      } while (uVar20 <= uVar9);
      if ((this->uninstantiatedSpecMap).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
          .size_ctrl.size <
          (this->uninstantiatedSpecMap).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
          .size_ctrl.ml) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::ast::detail::ClassSpecializationHasher,std::equal_to<slang::ast::detail::ClassSpecializationKey>,std::allocator<std::pair<slang::ast::detail::ClassSpecializationKey_const,slang::ast::Type_const*>>>
        ::
        nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::detail::ClassSpecializationKey&,slang::ast::ClassType*&>
                  (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::ast::detail::ClassSpecializationHasher,std::equal_to<slang::ast::detail::ClassSpecializationKey>,std::allocator<std::pair<slang::ast::detail::ClassSpecializationKey_const,slang::ast::Type_const*>>>
                         *)pPVar19,(arrays_type *)pPVar19,uVar21,uVar23,&local_309,&key,&classType);
        psVar1 = &(this->uninstantiatedSpecMap).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                  .size_ctrl.size;
        *psVar1 = *psVar1 + 1;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::ast::detail::ClassSpecializationHasher,std::equal_to<slang::ast::detail::ClassSpecializationKey>,std::allocator<std::pair<slang::ast::detail::ClassSpecializationKey_const,slang::ast::Type_const*>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::detail::ClassSpecializationKey&,slang::ast::ClassType*&>
                  (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::ast::detail::ClassSpecializationHasher,std::equal_to<slang::ast::detail::ClassSpecializationKey>,std::allocator<std::pair<slang::ast::detail::ClassSpecializationKey_const,slang::ast::Type_const*>>>
                         *)pPVar19,uVar23,&local_309,&key,&classType);
      }
    }
    else {
      auVar11._8_8_ = 0;
      auVar11._0_8_ = key.savedHash;
      pPVar19 = (ParameterValueAssignmentSyntax *)&this->specMap;
      uVar23 = SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar11,8) ^
               SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar11,0);
      uVar21 = uVar23 >> ((byte)(this->specMap).table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                                .arrays.groups_size_index & 0x3f);
      lVar18 = (uVar23 & 0xff) * 4;
      uVar27 = (&UNK_00474b6c)[lVar18];
      uVar28 = (&UNK_00474b6d)[lVar18];
      uVar29 = (&UNK_00474b6e)[lVar18];
      bVar30 = (&UNK_00474b6f)[lVar18];
      uVar17 = (ulong)((uint)uVar23 & 7);
      uVar20 = 0;
      uVar22 = uVar21;
      uVar31 = uVar27;
      uVar32 = uVar28;
      uVar33 = uVar29;
      bVar34 = bVar30;
      uVar35 = uVar27;
      uVar36 = uVar28;
      uVar37 = uVar29;
      bVar38 = bVar30;
      uVar39 = uVar27;
      uVar40 = uVar28;
      uVar41 = uVar29;
      bVar42 = bVar30;
      do {
        pgVar7 = (this->specMap).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                 .arrays.groups_;
        pgVar2 = pgVar7 + uVar22;
        bVar13 = pgVar2->m[0xf].n;
        auVar26[0] = -(pgVar2->m[0].n == uVar27);
        auVar26[1] = -(pgVar2->m[1].n == uVar28);
        auVar26[2] = -(pgVar2->m[2].n == uVar29);
        auVar26[3] = -(pgVar2->m[3].n == bVar30);
        auVar26[4] = -(pgVar2->m[4].n == uVar31);
        auVar26[5] = -(pgVar2->m[5].n == uVar32);
        auVar26[6] = -(pgVar2->m[6].n == uVar33);
        auVar26[7] = -(pgVar2->m[7].n == bVar34);
        auVar26[8] = -(pgVar2->m[8].n == uVar35);
        auVar26[9] = -(pgVar2->m[9].n == uVar36);
        auVar26[10] = -(pgVar2->m[10].n == uVar37);
        auVar26[0xb] = -(pgVar2->m[0xb].n == bVar38);
        auVar26[0xc] = -(pgVar2->m[0xc].n == uVar39);
        auVar26[0xd] = -(pgVar2->m[0xd].n == uVar40);
        auVar26[0xe] = -(pgVar2->m[0xe].n == uVar41);
        auVar26[0xf] = -(bVar13 == bVar42);
        uVar14 = (uint)(ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe);
        if (uVar14 != 0) {
          local_2e8 = pgVar7 + uVar22;
          ppVar8 = (this->specMap).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                   .arrays.elements_;
          local_2f8 = pPVar19;
          local_2e0 = uVar22;
          local_2d8 = uVar20;
          local_2d0 = uVar17;
          local_2c8 = uVar21;
          local_2b8 = uVar27;
          uStack_2b7 = uVar28;
          uStack_2b6 = uVar29;
          bStack_2b5 = bVar30;
          uStack_2b4 = uVar31;
          uStack_2b3 = uVar32;
          uStack_2b2 = uVar33;
          bStack_2b1 = bVar34;
          uStack_2b0 = uVar35;
          uStack_2af = uVar36;
          uStack_2ae = uVar37;
          bStack_2ad = bVar38;
          uStack_2ac = uVar39;
          uStack_2ab = uVar40;
          uStack_2aa = uVar41;
          bStack_2a9 = bVar42;
          do {
            local_2f0 = (ulong)uVar14;
            iVar15 = 0;
            if (uVar14 != 0) {
              for (; (uVar14 >> iVar15 & 1) == 0; iVar15 = iVar15 + 1) {
              }
            }
            other = (ClassSpecializationKey *)
                    ((long)&ppVar8[uVar22 * 0xf].first.paramValues._M_ptr +
                    (ulong)(uint)(iVar15 * 0x30));
            bVar12 = detail::ClassSpecializationKey::operator==(&key,other);
            if (bVar12) goto LAB_001db56a;
            uVar14 = (uint)local_2f0 - 1 & (uint)local_2f0;
          } while (uVar14 != 0);
          bVar13 = local_2e8->m[0xf].n;
          uVar17 = local_2d0;
          pPVar19 = local_2f8;
          uVar20 = local_2d8;
          uVar21 = local_2c8;
          uVar22 = local_2e0;
          uVar27 = local_2b8;
          uVar28 = uStack_2b7;
          uVar29 = uStack_2b6;
          bVar30 = bStack_2b5;
          uVar31 = uStack_2b4;
          uVar32 = uStack_2b3;
          uVar33 = uStack_2b2;
          bVar34 = bStack_2b1;
          uVar35 = uStack_2b0;
          uVar36 = uStack_2af;
          uVar37 = uStack_2ae;
          bVar38 = bStack_2ad;
          uVar39 = uStack_2ac;
          uVar40 = uStack_2ab;
          uVar41 = uStack_2aa;
          bVar42 = bStack_2a9;
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[uVar17] & bVar13) == 0) break;
        uVar9 = (this->specMap).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                .arrays.groups_size_mask;
        lVar18 = uVar22 + uVar20;
        uVar20 = uVar20 + 1;
        uVar22 = lVar18 + 1U & uVar9;
      } while (uVar20 <= uVar9);
      if ((this->specMap).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
          .size_ctrl.size <
          (this->specMap).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
          .size_ctrl.ml) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::ast::detail::ClassSpecializationHasher,std::equal_to<slang::ast::detail::ClassSpecializationKey>,std::allocator<std::pair<slang::ast::detail::ClassSpecializationKey_const,slang::ast::Type_const*>>>
        ::
        nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::detail::ClassSpecializationKey&,slang::ast::ClassType*&>
                  (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::ast::detail::ClassSpecializationHasher,std::equal_to<slang::ast::detail::ClassSpecializationKey>,std::allocator<std::pair<slang::ast::detail::ClassSpecializationKey_const,slang::ast::Type_const*>>>
                         *)pPVar19,(arrays_type *)pPVar19,uVar21,uVar23,&local_309,&key,&classType);
        psVar1 = &(this->specMap).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                  .size_ctrl.size;
        *psVar1 = *psVar1 + 1;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::ast::detail::ClassSpecializationHasher,std::equal_to<slang::ast::detail::ClassSpecializationKey>,std::allocator<std::pair<slang::ast::detail::ClassSpecializationKey_const,slang::ast::Type_const*>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::detail::ClassSpecializationKey&,slang::ast::ClassType*&>
                  (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::ast::detail::ClassSpecializationHasher,std::equal_to<slang::ast::detail::ClassSpecializationKey>,std::allocator<std::pair<slang::ast::detail::ClassSpecializationKey_const,slang::ast::Type_const*>>>
                         *)pPVar19,uVar23,&local_309,&key,&classType);
      }
    }
  }
  p_Var6 = (this->specializeFunc).callback;
  if (p_Var6 == (_func_void_intptr_t_Compilation_ptr_ClassType_ptr_SourceLocation *)0x0) {
    ClassType::populate(classType,local_2c0,
                        (ClassDeclarationSyntax *)(this->super_Symbol).originatingSyntax);
    pCVar24 = classType;
  }
  else {
    (*p_Var6)((this->specializeFunc).callable,local_300,classType,in_stack_fffffffffffffce8);
    pCVar24 = classType;
  }
  goto LAB_001db573;
LAB_001db56a:
  pCVar24 = (ClassType *)other[1].paramValues._M_ptr;
LAB_001db573:
  if (typeParams.super_SmallVectorBase<const_slang::ast::Type_*>.data_ !=
      (pointer)typeParams.super_SmallVectorBase<const_slang::ast::Type_*>.firstElement) {
    operator_delete(typeParams.super_SmallVectorBase<const_slang::ast::Type_*>.data_);
  }
  if (paramValues.super_SmallVectorBase<const_slang::ConstantValue_*>.data_ !=
      (pointer)paramValues.super_SmallVectorBase<const_slang::ConstantValue_*>.firstElement) {
    operator_delete(paramValues.super_SmallVectorBase<const_slang::ConstantValue_*>.data_);
  }
  boost::unordered::detail::foa::
  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
  ::delete_((allocator_type)paramBuilder.assignments.super_Storage._264_8_,
            (table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
             *)&paramBuilder.assignments.field_0x110);
LAB_001db5b8:
  this->recursionDepth = this->recursionDepth - 1;
  return &pCVar24->super_Type;
}

Assistant:

const Type* GenericClassDefSymbol::getSpecializationImpl(
    const ASTContext& context, SourceLocation instanceLoc, bool forceInvalidParams,
    const ParameterValueAssignmentSyntax* syntax) const {

    auto& comp = context.getCompilation();
    auto scope = getParentScope();
    SLANG_ASSERT(scope);

    auto guard = ScopeGuard([this] { recursionDepth--; });
    if (++recursionDepth > comp.getOptions().maxRecursiveClassSpecialization) {
        context.addDiag(diag::RecursiveClassSpecialization, instanceLoc) << name;
        return &comp.getErrorType();
    }

    // Create a class type instance to hold the parameters. If it turns out we already
    // have this specialization cached we'll throw it away, but that's not a big deal.
    auto classType = comp.emplace<ClassType>(comp, name, location);
    classType->genericClass = this;
    classType->isUninstantiated = forceInvalidParams || context.scope->isUninstantiated();
    classType->setParent(*scope, getIndex());

    // If this is for the default specialization, `syntax` will be null.
    // We want to suppress errors about params not having values and just
    // return null so that the caller can figure out if this is actually a problem.
    const bool isForDefault = syntax == nullptr;

    ParameterBuilder paramBuilder(*context.scope, name, paramDecls);
    paramBuilder.setForceInvalidValues(forceInvalidParams);
    paramBuilder.setSuppressErrors(isForDefault);
    paramBuilder.setInstanceContext(context);
    if (syntax)
        paramBuilder.setAssignments(*syntax, /* isFromConfig */ false);

    SourceRange instRange = {instanceLoc, instanceLoc + 1};

    SmallVector<const ConstantValue*> paramValues;
    SmallVector<const Type*> typeParams;
    for (auto& decl : paramDecls) {
        auto& param = paramBuilder.createParam(decl, *classType, instanceLoc);
        if (paramBuilder.hasErrors()) {
            if (isForDefault)
                return nullptr;

            // Otherwise use an error type instead.
            return &comp.getErrorType();
        }

        if (!param.isLocalParam()) {
            auto& sym = param.symbol;
            if (sym.kind == SymbolKind::Parameter) {
                auto& ps = sym.as<ParameterSymbol>();
                paramValues.push_back(&ps.getValue(instRange));
            }
            else {
                auto& tps = sym.as<TypeParameterSymbol>();
                typeParams.push_back(&tps.targetType.getType());
            }
        }
    }

    if (!forceInvalidParams) {
        detail::ClassSpecializationKey key(paramValues.copy(comp), typeParams.copy(comp));
        if (classType->isUninstantiated) {
            // If we're in an uninstantiated scope we save this specialization
            // in a separate map so that we don't try to elaborate it further
            // and potentially cause spurious errors to be issued.
            auto [it, inserted] = uninstantiatedSpecMap.emplace(key, classType);
            if (!inserted)
                return it->second;
        }
        else {
            auto [it, inserted] = specMap.emplace(key, classType);
            if (!inserted)
                return it->second;
        }
    }

    // Not found, so this is a new entry. Fill in its members and store the
    // specialization for later lookup. If we have a specialization function,
    // call that instead of trying to create from our syntax node.
    if (specializeFunc)
        specializeFunc(comp, *classType, instanceLoc);
    else
        classType->populate(*scope, getSyntax()->as<ClassDeclarationSyntax>());

    return classType;
}